

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCl.c
# Opt level: O3

uint32_t Hacl_SecretBox_ZeroPad_crypto_secretbox_detached
                   (uint8_t *c,uint8_t *mac,uint8_t *m,uint64_t mlen,uint8_t *n1,uint8_t *k1)

{
  uint32_t extraout_EAX;
  uint8_t local_58 [40];
  
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  Hacl_Salsa20_hsalsa20(local_58,k1,n1);
  Hacl_Salsa20_salsa20(c,m,(int)mlen + 0x20,local_58,n1 + 0x10,0);
  Hacl_Poly1305_64_crypto_onetimeauth(mac,c + 0x20,mlen,c);
  c[0x10] = '\0';
  c[0x11] = '\0';
  c[0x12] = '\0';
  c[0x13] = '\0';
  c[0x14] = '\0';
  c[0x15] = '\0';
  c[0x16] = '\0';
  c[0x17] = '\0';
  c[0x18] = '\0';
  c[0x19] = '\0';
  c[0x1a] = '\0';
  c[0x1b] = '\0';
  c[0x1c] = '\0';
  c[0x1d] = '\0';
  c[0x1e] = '\0';
  c[0x1f] = '\0';
  c[0] = '\0';
  c[1] = '\0';
  c[2] = '\0';
  c[3] = '\0';
  c[4] = '\0';
  c[5] = '\0';
  c[6] = '\0';
  c[7] = '\0';
  c[8] = '\0';
  c[9] = '\0';
  c[10] = '\0';
  c[0xb] = '\0';
  c[0xc] = '\0';
  c[0xd] = '\0';
  c[0xe] = '\0';
  c[0xf] = '\0';
  return extraout_EAX;
}

Assistant:

static uint32_t
Hacl_SecretBox_ZeroPad_crypto_secretbox_detached(
  uint8_t *c,
  uint8_t *mac,
  uint8_t *m,
  uint64_t mlen,
  uint8_t *n1,
  uint8_t *k1
)
{
  uint32_t mlen_ = (uint32_t)mlen;
  uint8_t subkey[32U] = { 0U };
  Hacl_Salsa20_hsalsa20(subkey, k1, n1);
  Hacl_Salsa20_salsa20(c, m, mlen_ + (uint32_t)32U, subkey, n1 + (uint32_t)16U, (uint64_t)0U);
  Hacl_Poly1305_64_crypto_onetimeauth(mac, c + (uint32_t)32U, mlen, c);
  Hacl_SecretBox_ZeroPad_set_zero_bytes(c);
  Hacl_SecretBox_ZeroPad_set_zero_bytes(subkey);
  return (uint32_t)0U;
}